

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_epsv_disable(connectdata *conn)

{
  CURLcode result;
  connectdata *conn_local;
  
  if (((((conn->bits).ipv6 & 1U) == 0) || (((conn->bits).tunnel_proxy & 1U) != 0)) ||
     (((conn->bits).socksproxy & 1U) != 0)) {
    Curl_infof(conn->data,"Failed EPSV attempt. Disabling EPSV\n");
    (conn->bits).ftp_use_epsv = false;
    (conn->data->state).errorbuf = false;
    conn_local._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","PASV");
    if (conn_local._4_4_ == CURLE_OK) {
      (conn->proto).ftpc.count1 = (conn->proto).ftpc.count1 + 1;
      _state(conn,FTP_PASV);
    }
  }
  else {
    Curl_failf(conn->data,"Failed EPSV attempt, exiting\n");
    conn_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_epsv_disable(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.ipv6 && !(conn->bits.tunnel_proxy || conn->bits.socksproxy)) {
    /* We can't disable EPSV when doing IPv6, so this is instead a fail */
    failf(conn->data, "Failed EPSV attempt, exiting\n");
    return CURLE_WEIRD_SERVER_REPLY;
  }

  infof(conn->data, "Failed EPSV attempt. Disabling EPSV\n");
  /* disable it for next transfer */
  conn->bits.ftp_use_epsv = FALSE;
  conn->data->state.errorbuf = FALSE; /* allow error message to get
                                         rewritten */
  PPSENDF(&conn->proto.ftpc.pp, "%s", "PASV");
  conn->proto.ftpc.count1++;
  /* remain in/go to the FTP_PASV state */
  state(conn, FTP_PASV);
  return result;
}